

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O1

void __thiscall proto2_unittest::TestOneofParsingLite::clear_oneof_field(TestOneofParsingLite *this)

{
  anon_union_16_1_493b367e_for_TestOneofParsingLite_3 *this_00;
  uint32_t uVar1;
  ulong uVar2;
  TestAllTypesLite *this_01;
  
  uVar1 = (this->field_0)._impl_._oneof_case_[0];
  if (uVar1 - 2 < 7) {
    this_00 = &this->field_0;
    switch(uVar1) {
    case 2:
      uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
      if ((uVar2 & 1) != 0) {
        uVar2 = *(ulong *)(uVar2 & 0xfffffffffffffffe);
      }
      this_01 = *(TestAllTypesLite **)this_00;
      if (uVar2 != 0) {
        if (this_01 != (TestAllTypesLite *)0x0) {
          TestAllTypesLite::Clear(this_01);
        }
        goto LAB_00d7418f;
      }
      if (this_01 == (TestAllTypesLite *)0x0) goto LAB_00d7418f;
      TestAllTypesLite::SharedDtor(&this_01->super_MessageLite);
      uVar2 = 0x348;
      break;
    default:
      google::protobuf::internal::ArenaStringPtr::Destroy((ArenaStringPtr *)&this_00->_impl_);
      goto LAB_00d7418f;
    case 6:
      uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
      if ((uVar2 & 1) != 0) {
        uVar2 = *(ulong *)(uVar2 & 0xfffffffffffffffe);
      }
      if ((uVar2 != 0) ||
         (this_01 = *(TestAllTypesLite **)this_00, this_01 == (TestAllTypesLite *)0x0))
      goto LAB_00d7418f;
      absl::lts_20250127::Cord::~Cord((Cord *)this_01);
      uVar2 = 0x10;
    }
    operator_delete(this_01,uVar2);
  }
LAB_00d7418f:
  (this->field_0)._impl_._oneof_case_[0] = 0;
  return;
}

Assistant:

void TestOneofParsingLite::clear_oneof_field() {
// @@protoc_insertion_point(one_of_clear_start:proto2_unittest.TestOneofParsingLite)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  switch (oneof_field_case()) {
    case kOneofInt32: {
      // No need to clear
      break;
    }
    case kOneofSubmessage: {
      if (GetArena() == nullptr) {
        delete _impl_.oneof_field_.oneof_submessage_;
      } else if (::google::protobuf::internal::DebugHardenClearOneofMessageOnArena()) {
        if (_impl_.oneof_field_.oneof_submessage_ != nullptr) {
          _impl_.oneof_field_.oneof_submessage_->Clear();
        }
      }
      break;
    }
    case kOneofString: {
      _impl_.oneof_field_.oneof_string_.Destroy();
      break;
    }
    case kOneofBytes: {
      _impl_.oneof_field_.oneof_bytes_.Destroy();
      break;
    }
    case kOneofStringCord: {
      _impl_.oneof_field_.oneof_string_cord_.Destroy();
      break;
    }
    case kOneofBytesCord: {
      if (GetArena() == nullptr) {
        delete _impl_.oneof_field_.oneof_bytes_cord_;
      }
      break;
    }
    case kOneofStringStringPiece: {
      _impl_.oneof_field_.oneof_string_string_piece_.Destroy();
      break;
    }
    case kOneofBytesStringPiece: {
      _impl_.oneof_field_.oneof_bytes_string_piece_.Destroy();
      break;
    }
    case kOneofEnum: {
      // No need to clear
      break;
    }
    case ONEOF_FIELD_NOT_SET: {
      break;
    }
  }
  _impl_._oneof_case_[0] = ONEOF_FIELD_NOT_SET;
}